

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test::TestBody
          (InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test *this)

{
  pointer *this_00;
  undefined8 this_01;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_968;
  Message local_960;
  int local_954;
  size_type local_950;
  undefined1 local_948 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_918;
  Message local_910;
  Value local_908;
  bool local_8b9;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_;
  Message local_8a0;
  ErrorCode local_894;
  Error local_890;
  ErrorCode local_864;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_2;
  string local_848;
  Expression local_828;
  undefined1 local_810 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  Expression ret;
  Expression expr;
  Message local_7c0;
  Status local_7b1;
  UnixTime local_7b0;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_758;
  allocator local_731;
  string local_730;
  Timestamp local_710;
  allocator local_701;
  string local_700;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  State local_690;
  allocator local_689;
  string local_688;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_668;
  allocator local_641;
  string local_640;
  BorderAgent local_620;
  Status local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_488;
  Message local_480;
  Status local_471;
  UnixTime local_470;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  allocator local_3f1;
  string local_3f0;
  Timestamp local_3d0;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  State local_350;
  allocator local_349;
  string local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  allocator local_301;
  string local_300;
  BorderAgent local_2e0;
  Status local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  this_01 = ctx.mInterpreter._192_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"127.0.0.1",&local_301);
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"1.1",&local_349);
  ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"net1",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"",&local_3c1);
  local_3d0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"domain1",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"",&local_461);
  ot::commissioner::UnixTime::UnixTime(&local_470,0);
  ot::commissioner::BorderAgent::BorderAgent
            (&local_2e0,&local_300,0x4e21,&local_328,&local_348,local_350,&local_370,1,&local_398,
             &local_3c0,local_3d0,0,&local_3f0,&local_418,&local_438,'\0',0,&local_460,local_470,
             0x103f);
  local_161 = ot::commissioner::persistent_storage::Registry::Add((Registry *)this_01,&local_2e0);
  local_471 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
            ((EqHelper *)local_160,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_161,&local_471);
  ot::commissioner::BorderAgent::~BorderAgent(&local_2e0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message(&local_480);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_640,"127.0.0.2",&local_641);
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"1.1",&local_689);
    ot::commissioner::BorderAgent::State::State(&local_690,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b0,"net2",&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d8,"",&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_700,"",&local_701);
    local_710 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"",&local_731);
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"domain2",&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a0,"",&local_7a1);
    ot::commissioner::UnixTime::UnixTime(&local_7b0,0);
    pcVar2 = (char *)(ulong)(uint)local_690;
    ot::commissioner::BorderAgent::BorderAgent
              (&local_620,&local_640,0x4e21,&local_668,&local_688,local_690,&local_6b0,2,&local_6d8,
               &local_700,local_710,0,&local_730,&local_758,&local_778,'\0',0,&local_7a0,local_7b0,
               0x103f);
    local_4a1 = ot::commissioner::persistent_storage::Registry::Add
                          ((Registry *)ctx.mInterpreter._192_8_,&local_620);
    local_7b1 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
              ((EqHelper *)local_4a0,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_4a1,&local_7b1);
    ot::commissioner::BorderAgent::~BorderAgent(&local_620);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_758);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_668);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
    if (!bVar1) {
      testing::Message::Message(&local_7c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x1c2,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7c0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_7c0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ret.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_810);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_848,"start --nwk 1 net1",
                 (allocator *)
                 ((long)&gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      ot::commissioner::Interpreter::ParseExpression(&local_828,(Interpreter *)local_140,&local_848)
      ;
      this_00 = &ret.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&local_828);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_828);
      std::__cxx11::string::~string((string *)&local_848);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
                (&local_890,(Interpreter *)local_140,(Expression *)this_00,
                 (Expression *)
                 &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_864 = ot::commissioner::Error::GetCode(&local_890);
      local_894 = kNone;
      testing::internal::EqHelper::
      Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                ((EqHelper *)local_860,
                 "ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode()",
                 "ErrorCode::kNone",&local_864,&local_894);
      ot::commissioner::Error::~Error(&local_890);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
      if (!bVar1) {
        testing::Message::Message(&local_8a0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_8a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        testing::Message::~Message(&local_8a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
      ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
                (&local_908,(Interpreter *)local_140,
                 (Expression *)
                 &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_810);
      local_8b9 = ot::commissioner::Interpreter::Value::HasNoError(&local_908);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_8b8,&local_8b9,(type *)0x0);
      ot::commissioner::Interpreter::Value::~Value(&local_908);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
      if (!bVar1) {
        testing::Message::Message(&local_910);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_3.message_,(internal *)local_8b8,
                   (AssertionResult *)
                   "ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError()","false",
                   "true",pcVar2);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_918,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_918,&local_910);
        testing::internal::AssertHelper::~AssertHelper(&local_918);
        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_910);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
      local_950 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_810);
      local_954 = 1;
      testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
                ((EqHelper *)local_948,"nids.size()","1",&local_950,&local_954);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_948);
      if (!bVar1) {
        testing::Message::Message(&local_960);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_948);
        testing::internal::AssertHelper::AssertHelper
                  (&local_968,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_968,&local_960);
        testing::internal::AssertHelper::~AssertHelper(&local_968);
        testing::Message::~Message(&local_960);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_948);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_810);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ret.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_SameResolutionFromTwoAliasesCollapses)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --nwk 1 net1");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_EQ(nids.size(), 1);
}